

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3>::TPZManVector
          (TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3> *this,int64_t size)

{
  undefined1 auVar1 [16];
  TPZManVector<TFad<6,_double>,_3> *pTVar2;
  ulong uVar3;
  ulong *puVar4;
  TFad<6,_double> *pTVar5;
  ulong in_RSI;
  TPZManVector<TFad<6,_double>,_3> *in_RDI;
  ulong uVar6;
  TFad<6,_double> *local_80;
  int64_t in_stack_ffffffffffffffa8;
  TPZVec<TPZManVector<TFad<6,_double>,_3>_> *in_stack_ffffffffffffffb0;
  TFad<6,_double> *local_28;
  
  TPZVec<TPZManVector<TFad<6,_double>,_3>_>::TPZVec
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  (in_RDI->super_TPZVec<TFad<6,_double>_>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_02439238;
  pTVar2 = in_RDI + 3;
  pTVar5 = in_RDI->fExtAlloc;
  do {
    local_28 = pTVar5;
    TPZManVector<TFad<6,_double>,_3>::TPZManVector(in_RDI,(int64_t)local_28);
    pTVar5 = (TFad<6,_double> *)((long)(local_28 + 3) + 0x20);
  } while ((TFad<6,_double> *)((long)(local_28 + 3) + 0x20) != pTVar2->fExtAlloc);
  if ((long)in_RSI < 4) {
    (in_RDI->super_TPZVec<TFad<6,_double>_>).fStore = in_RDI->fExtAlloc;
    (in_RDI->super_TPZVec<TFad<6,_double>_>).fNElements = in_RSI;
    (in_RDI->super_TPZVec<TFad<6,_double>_>).fNAlloc = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RSI;
    uVar3 = SUB168(auVar1 * ZEXT816(0xe0),0);
    uVar6 = uVar3 + 8;
    if (0xfffffffffffffff7 < uVar3) {
      uVar6 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(0xe0),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar4 = (ulong *)operator_new__(uVar6);
    *puVar4 = in_RSI;
    pTVar5 = (TFad<6,_double> *)(puVar4 + 1);
    if (in_RSI != 0) {
      local_80 = pTVar5;
      do {
        TPZManVector<TFad<6,_double>,_3>::TPZManVector(in_RDI,(int64_t)local_28);
        local_80 = (TFad<6,_double> *)(local_80[3].dx_ + 2);
      } while (local_80 != (TFad<6,_double> *)((long)pTVar5 + in_RSI * 0xe0));
    }
    (in_RDI->super_TPZVec<TFad<6,_double>_>).fStore = pTVar5;
    (in_RDI->super_TPZVec<TFad<6,_double>_>).fNElements = in_RSI;
    (in_RDI->super_TPZVec<TFad<6,_double>_>).fNAlloc = in_RSI;
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size) :
TPZVec<T>(0) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }
}